

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregator.hpp
# Opt level: O3

void __thiscall
duckdb::WindowAggregatorGlobalState::WindowAggregatorGlobalState
          (WindowAggregatorGlobalState *this,ClientContext *context,WindowAggregator *aggregator_p,
          idx_t group_count)

{
  Expression *pEVar1;
  Allocator *allocator;
  _Head_base<0UL,_bool_*,_false> __s;
  
  (this->super_WindowAggregatorState)._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowAggregatorState_0246bb18;
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&(this->super_WindowAggregatorState).allocator,allocator,0x800);
  (this->super_WindowAggregatorState)._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowAggregatorGlobalState_0246bce8;
  this->context = context;
  this->aggregator = aggregator_p;
  AggregateObject::AggregateObject(&this->aggr,aggregator_p->wexpr);
  (this->filter_mask).capacity = 0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  (this->locals).super___atomic_base<unsigned_long>._M_i = 0;
  (this->finalized).super___atomic_base<unsigned_long>._M_i = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->filter_mask).validity_mask = (bool *)0x0;
  (this->filter_mask).validity_data.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  pEVar1 = (this->aggr).filter;
  (this->filter_mask).capacity = group_count;
  if (pEVar1 != (Expression *)0x0) {
    __s._M_head_impl = (bool *)operator_new__(group_count);
    (this->filter_mask).validity_data.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
    super__Head_base<0UL,_bool_*,_false>._M_head_impl = __s._M_head_impl;
    (this->filter_mask).validity_mask = __s._M_head_impl;
    switchD_01043a80::default(__s._M_head_impl,0,group_count);
    return;
  }
  return;
}

Assistant:

WindowAggregatorGlobalState(ClientContext &context, const WindowAggregator &aggregator_p, idx_t group_count)
	    : context(context), aggregator(aggregator_p), aggr(aggregator.wexpr), locals(0), finalized(0) {

		if (aggr.filter) {
			// 	Start with all invalid and set the ones that pass
			filter_mask.Initialize(group_count, false);
		} else {
			filter_mask.InitializeEmpty(group_count);
		}
	}